

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CardGroup.cpp
# Opt level: O0

CardGroup * __thiscall CardGroup::last(CardGroup *__return_storage_ptr__,CardGroup *this,int n)

{
  size_type sVar1;
  const_reference ppCVar2;
  int local_24;
  int pos;
  int n_local;
  CardGroup *this_local;
  CardGroup *g;
  
  CardGroup(__return_storage_ptr__);
  sVar1 = std::vector<Card_*,_std::allocator<Card_*>_>::size(&this->cards);
  local_24 = (int)sVar1;
  if (((this->top < local_24) && (-1 < local_24)) && (pos = n, 0 < n)) {
    while (pos != 0) {
      while (ppCVar2 = std::vector<Card_*,_std::allocator<Card_*>_>::operator[]
                                 (&this->cards,(long)local_24), *ppCVar2 == (value_type)0x0) {
        local_24 = local_24 + -1;
        if (local_24 <= this->top) {
          return __return_storage_ptr__;
        }
        if (local_24 < 0) {
          return __return_storage_ptr__;
        }
      }
      ppCVar2 = std::vector<Card_*,_std::allocator<Card_*>_>::operator[]
                          (&this->cards,(long)local_24);
      add(__return_storage_ptr__,*ppCVar2);
      pos = pos + -1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CardGroup CardGroup::last(int n) const {
        CardGroup g;
        int pos = this->cards.size();
        if(top >= pos || pos < 0 || n <=0) return g;
        while(n--) {
                while(this->cards[pos] == NULL) {
                        pos--;
                        if(top >= pos || pos < 0) return g;
                }
                g.add(this->cards[pos]);
        }
        return g;
}